

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  int iVar1;
  int in_ECX;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  limitedOutput_directive unaff_retaddr;
  tableType_t in_stack_00000008;
  dict_directive in_stack_00000010;
  dictIssue_directive in_stack_00000018;
  int in_stack_00000020;
  tableType_t tableType_3;
  tableType_t tableType_2;
  tableType_t tableType_1;
  tableType_t tableType;
  LZ4_stream_t_internal *ctx;
  tableType_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar2;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int local_4;
  
  if (in_R9D < 1) {
    in_R9D = 1;
  }
  if (0x10001 < in_R9D) {
    in_R9D = 0x10001;
  }
  iVar3 = in_R8D;
  iVar1 = LZ4_compressBound(in_ECX);
  if (in_R8D < iVar1) {
    if (in_ECX < 0x1000b) {
      uVar2 = 3;
      LZ4_prepareTable((LZ4_stream_t_internal *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      if (*(int *)(in_RDI + 0x4010) == 0) {
        local_4 = LZ4_compress_generic
                            ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar3),
                             (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI,
                             in_stack_ffffffffffffffc4,
                             (int *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),in_R8D,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020
                            );
      }
      else {
        local_4 = LZ4_compress_generic
                            ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar3),
                             (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI,
                             in_stack_ffffffffffffffc4,
                             (int *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),in_R8D,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020
                            );
      }
    }
    else {
      uVar2 = 2;
      LZ4_prepareTable((LZ4_stream_t_internal *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_4 = LZ4_compress_generic
                          ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar3),
                           (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI,
                           in_stack_ffffffffffffffc4,
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,uVar2),in_R8D,unaff_retaddr,
                           in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
    }
  }
  else if (in_ECX < 0x1000b) {
    iVar1 = 3;
    LZ4_prepareTable((LZ4_stream_t_internal *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    if (*(int *)(in_RDI + 0x4010) == 0) {
      local_4 = LZ4_compress_generic
                          ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar3),
                           (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI,iVar1,
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           in_R8D,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                           in_stack_00000018,in_stack_00000020);
    }
    else {
      local_4 = LZ4_compress_generic
                          ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar3),
                           (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI,iVar1,
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           in_R8D,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                           in_stack_00000018,in_stack_00000020);
    }
  }
  else {
    LZ4_prepareTable((LZ4_stream_t_internal *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    local_4 = LZ4_compress_generic
                        ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar3),
                         (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI,
                         in_stack_ffffffffffffffc4,
                         (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_R8D
                         ,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020);
  }
  return local_4;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}